

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void ssh1_compute_session_id(uchar *session_id,uchar *cookie,RSAKey *hostkey,RSAKey *servkey)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  ssh_hash *psVar3;
  size_t sVar4;
  ulong uVar5;
  
  psVar3 = md5_new(&ssh_md5);
  if (psVar3 != (ssh_hash *)0x0) {
    (*psVar3->vt->reset)(psVar3);
  }
  sVar4 = mp_get_nbits(hostkey->modulus);
  if (7 < sVar4 + 7) {
    uVar5 = sVar4 + 7 >> 3;
    do {
      uVar5 = uVar5 - 1;
      pBVar1 = psVar3->binarysink_;
      uVar2 = mp_get_byte(hostkey->modulus,uVar5);
      BinarySink_put_byte(pBVar1,uVar2);
    } while (uVar5 != 0);
  }
  sVar4 = mp_get_nbits(servkey->modulus);
  if (7 < sVar4 + 7) {
    uVar5 = sVar4 + 7 >> 3;
    do {
      uVar5 = uVar5 - 1;
      pBVar1 = psVar3->binarysink_;
      uVar2 = mp_get_byte(servkey->modulus,uVar5);
      BinarySink_put_byte(pBVar1,uVar2);
    } while (uVar5 != 0);
  }
  BinarySink_put_data(psVar3->binarysink_,cookie,8);
  (*psVar3->vt->digest)(psVar3,session_id);
  (*psVar3->vt->free)(psVar3);
  return;
}

Assistant:

void ssh1_compute_session_id(
    unsigned char *session_id, const unsigned char *cookie,
    RSAKey *hostkey, RSAKey *servkey)
{
    ssh_hash *hash = ssh_hash_new(&ssh_md5);

    for (size_t i = (mp_get_nbits(hostkey->modulus) + 7) / 8; i-- ;)
        put_byte(hash, mp_get_byte(hostkey->modulus, i));
    for (size_t i = (mp_get_nbits(servkey->modulus) + 7) / 8; i-- ;)
        put_byte(hash, mp_get_byte(servkey->modulus, i));
    put_data(hash, cookie, 8);
    ssh_hash_final(hash, session_id);
}